

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::SerializeMessageTo<google::protobuf::io::CodedOutputStream>
               (MessageLite *msg,void *table_ptr,CodedOutputStream *output)

{
  uint *puVar1;
  int iVar2;
  undefined4 extraout_var;
  uint8 *base;
  undefined4 local_30;
  int local_2c;
  
  if (table_ptr == (void *)0x0) {
    local_2c = (*msg->_vptr_MessageLite[10])(msg);
    PrimitiveTypeHelper<13>::Serialize(&local_2c,output);
    iVar2 = (*msg->_vptr_MessageLite[0xc])(msg,output->cur_,output);
    output->cur_ = (uint8 *)CONCAT44(extraout_var,iVar2);
  }
  else {
    puVar1 = *(uint **)((long)table_ptr + 8);
    local_30 = *(undefined4 *)((long)&msg->_vptr_MessageLite + (ulong)*puVar1);
    PrimitiveTypeHelper<13>::Serialize(&local_30,output);
    SerializeInternal((uint8 *)msg,(FieldMetadata *)(puVar1 + 6),*table_ptr + -1,output);
  }
  return;
}

Assistant:

void SerializeMessageTo(const MessageLite* msg, const void* table_ptr,
                        O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    WriteLengthTo(msg->GetCachedSize(), output);
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8* base = reinterpret_cast<const uint8*>(msg);
  int cached_size = *reinterpret_cast<const int32*>(base + field_table->offset);
  WriteLengthTo(cached_size, output);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}